

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AeronArchive.cpp
# Opt level: O3

shared_ptr<aeron::Subscription> __thiscall
aeron::archive::AeronArchive::replay
          (AeronArchive *this,int64_t recordingId,int64_t position,int64_t length,
          string *replayChannel,int32_t replayStreamId)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<aeron::Subscription> sVar2;
  uint in_stack_00000008;
  code *local_58;
  undefined8 local_50;
  code *local_48;
  code *local_40;
  on_unavailable_image_t local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  local_38.super__Function_base._M_functor._8_8_ = 0;
  local_38.super__Function_base._M_functor._M_unused._M_object = defaultOnAvailableImageHandler;
  local_38._M_invoker =
       std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
  local_38.super__Function_base._M_manager =
       std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
  local_50 = 0;
  local_58 = defaultOnUnavailableImageHandler;
  local_40 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_invoke;
  local_48 = std::_Function_handler<void_(aeron::Image_&),_void_(*)(aeron::Image_&)>::_M_manager;
  sVar2 = replay(this,recordingId,position,length,replayChannel,replayStreamId,
                 (on_available_image_t *)(ulong)in_stack_00000008,&local_38);
  _Var1 = sVar2.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_38.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_38.super__Function_base._M_manager)
              ((_Any_data *)&local_38,(_Any_data *)&local_38,__destroy_functor);
    _Var1._M_pi = extraout_RDX_00;
  }
  sVar2.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var1._M_pi;
  sVar2.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<aeron::Subscription>)
         sVar2.super___shared_ptr<aeron::Subscription,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<aeron::Subscription> AeronArchive::replay(std::int64_t recordingId, std::int64_t position,
                                                          std::int64_t length, const std::string& replayChannel,
                                                          std::int32_t replayStreamId) {
    return replay(recordingId, position, length, replayChannel, replayStreamId, defaultOnAvailableImageHandler,
                  defaultOnUnavailableImageHandler);
}